

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O2

LY_ERR lysp_check_dup_ht_insert(lysp_ctx *ctx,ly_ht *ht,char *name,char *statement,char *err_detail)

{
  uint32_t hash;
  LY_ERR LVar1;
  size_t len;
  char *format;
  ly_ctx *ctx_00;
  char *name_local;
  
  name_local = name;
  len = strlen(name);
  hash = lyht_hash(name,len);
  LVar1 = lyht_insert(ht,&name_local,hash,(void **)0x0);
  if (LVar1 == LY_EEXIST) {
    if (err_detail == (char *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        ctx_00 = (ly_ctx *)0x0;
      }
      else {
        ctx_00 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      format = "Duplicate identifier \"%s\" of %s statement.";
    }
    else {
      if (ctx == (lysp_ctx *)0x0) {
        ctx_00 = (ly_ctx *)0x0;
      }
      else {
        ctx_00 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      format = "Duplicate identifier \"%s\" of %s statement - %s.";
    }
    ly_vlog(ctx_00,(char *)0x0,LYVE_SYNTAX_YANG,format,name_local,statement);
    LVar1 = LY_EVALID;
  }
  return LVar1;
}

Assistant:

static LY_ERR
lysp_check_dup_ht_insert(struct lysp_ctx *ctx, struct ly_ht *ht, const char *name, const char *statement,
        const char *err_detail)
{
    LY_ERR ret;
    uint32_t hash;

    hash = lyht_hash(name, strlen(name));
    ret = lyht_insert(ht, &name, hash, NULL);
    if (ret == LY_EEXIST) {
        if (err_detail) {
            LOGVAL_PARSER(ctx, LY_VCODE_DUPIDENT2, name, statement, err_detail);
        } else {
            LOGVAL_PARSER(ctx, LY_VCODE_DUPIDENT, name, statement);
        }
        ret = LY_EVALID;
    }

    return ret;
}